

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonvalue.cpp
# Opt level: O0

QJsonObject __thiscall QJsonValue::toObject(QJsonValue *this,QJsonObject *defaultValue)

{
  bool bVar1;
  QCborValue *in_RSI;
  QCborContainerPrivate *in_RDI;
  qint64 n;
  QCborContainerPrivate *container;
  QCborContainerPrivate *dd;
  QExplicitlySharedDataPointer<QCborContainerPrivate> this_00;
  
  this_00.d.ptr =
       (totally_ordered_wrapper<QCborContainerPrivate_*>)
       (totally_ordered_wrapper<QCborContainerPrivate_*>)in_RDI;
  bVar1 = isObject((QJsonValue *)0x1bd782);
  if (bVar1) {
    QJsonPrivate::Value::container(in_RSI);
    QJsonPrivate::Value::valueHelper(in_RSI);
    QJsonObject::QJsonObject((QJsonObject *)this_00.d.ptr,in_RDI);
  }
  else {
    QJsonObject::QJsonObject((QJsonObject *)this_00.d.ptr,(QJsonObject *)in_RDI);
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this_00.d.ptr;
}

Assistant:

QJsonObject QJsonValue::toObject(const QJsonObject &defaultValue) const
{
    if (!isObject())
        return defaultValue;
    QCborContainerPrivate *dd = nullptr;
    const auto container = QJsonPrivate::Value::container(value);
    const auto n = QJsonPrivate::Value::valueHelper(value);
    Q_ASSERT(n == -1 || container == nullptr);
    if (n < 0)
        dd = container;
    return QJsonObject(dd);
}